

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *pfVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  uint id;
  byte *pbVar7;
  basic_string_view<char> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_1
  local_48;
  type local_38;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar3 = handler->handler;
    basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
    ::next_arg((format_arg *)&local_48.string,&pfVar3->context);
    (pfVar3->arg).type_ = local_38;
    (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      id = 0;
      pcVar6 = begin;
      if (bVar1 != 0x30) {
        while (id < 0xccccccd) {
          id = ((int)pcVar6[-1] + id * 10) - 0x30;
          begin = end;
          if ((pcVar6 == end) ||
             (cVar2 = *pcVar6, begin = pcVar6, pcVar6 = pcVar6 + 1, 9 < (byte)(cVar2 - 0x30U)))
          goto LAB_0016354b;
        }
        id = 0x80000000;
        begin = pcVar6 + -1;
LAB_0016354b:
        if ((int)id < 0) {
          error_handler::on_error((error_handler *)handler->handler,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
        ::on_arg_id(handler->handler,id);
        return begin;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar5 = (byte *)(begin + 1);
      do {
        pbVar4 = pbVar5;
        pbVar7 = (byte *)end;
        if (pbVar4 == (byte *)end) break;
        bVar1 = *pbVar4;
        pbVar5 = pbVar4 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar7 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar7 - (long)begin;
      pfVar3 = handler->handler;
      name.data_ = begin;
      basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
      ::get_arg((format_arg *)&local_48.string,&pfVar3->context,name);
      (pfVar3->arg).type_ = local_38;
      (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
      (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
      return (char *)pbVar7;
    }
    error_handler::on_error((error_handler *)handler->handler,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}